

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O3

CBNode * __thiscall asmjit::CodeBuilder::addAfter(CodeBuilder *this,CBNode *node,CBNode *ref)

{
  void *pvVar1;
  CBNode *extraout_RAX;
  CBNode *pCVar2;
  CBNode **ppCVar3;
  CBNode *pCVar4;
  CBNode *extraout_RDX;
  CBNode *pCVar5;
  CBNode *extraout_RDX_00;
  CBNode *pCVar6;
  bool bVar7;
  
  if (node == (CBNode *)0x0) {
    addAfter();
LAB_00112a74:
    addAfter();
LAB_00112a79:
    addAfter();
  }
  else {
    if (ref == (CBNode *)0x0) goto LAB_00112a74;
    if (node->_prev != (CBNode *)0x0) goto LAB_00112a79;
    if (node->_next == (CBNode *)0x0) {
      pCVar2 = ref->_next;
      node->_prev = ref;
      node->_next = pCVar2;
      ref->_next = node;
      pCVar4 = (CBNode *)&this->_lastNode;
      if (pCVar2 != (CBNode *)0x0) {
        pCVar4 = pCVar2;
      }
      pCVar4->_prev = node;
      return node;
    }
  }
  addAfter();
  if (node == (CBNode *)0x0) {
    addBefore();
LAB_00112ac8:
    addBefore();
  }
  else {
    if (node->_prev != (CBNode *)0x0) goto LAB_00112ac8;
    if (node->_next == (CBNode *)0x0) {
      if (extraout_RDX != (CBNode *)0x0) {
        pCVar2 = extraout_RDX->_prev;
        node->_prev = pCVar2;
        node->_next = extraout_RDX;
        extraout_RDX->_prev = node;
        ppCVar3 = &pCVar2->_next;
        if (pCVar2 == (CBNode *)0x0) {
          ppCVar3 = &this->_firstNode;
        }
        *ppCVar3 = node;
        return node;
      }
      goto LAB_00112ad2;
    }
  }
  addBefore();
LAB_00112ad2:
  addBefore();
  pCVar2 = node->_prev;
  ppCVar3 = &pCVar2->_next;
  if (this->_firstNode == node) {
    ppCVar3 = &this->_firstNode;
  }
  pCVar4 = node->_next;
  *ppCVar3 = pCVar4;
  pCVar5 = (CBNode *)&this->_lastNode;
  if (this->_lastNode != node) {
    pCVar5 = pCVar4;
  }
  pCVar5->_prev = pCVar2;
  node->_prev = (CBNode *)0x0;
  node->_next = (CBNode *)0x0;
  if (this->_cursor == node) {
    this->_cursor = pCVar2;
  }
  if (((node->_flags & 0x30) != 0) && (pvVar1 = node[1]._passData, pvVar1 != (void *)0x0)) {
    pCVar2 = *(CBNode **)((long)pvVar1 + 0x30);
    if (pCVar2 == (CBNode *)0x0) {
LAB_00112b6b:
      removeNode();
      if (node == extraout_RDX_00) {
        pCVar2 = removeNode(this,node);
        return pCVar2;
      }
      pCVar2 = node->_prev;
      pCVar4 = extraout_RDX_00->_next;
      ppCVar3 = &pCVar2->_next;
      if (this->_firstNode == node) {
        ppCVar3 = &this->_firstNode;
      }
      *ppCVar3 = pCVar4;
      pCVar5 = (CBNode *)&this->_lastNode;
      if (this->_lastNode != extraout_RDX_00) {
        pCVar5 = pCVar4;
      }
      pCVar5->_prev = pCVar2;
      do {
        pCVar4 = node->_next;
        if (pCVar4 == (CBNode *)0x0) {
LAB_00112c26:
          removeNodes();
          pCVar2 = this->_cursor;
          this->_cursor = pCVar4;
          return pCVar2;
        }
        node->_prev = (CBNode *)0x0;
        node->_next = (CBNode *)0x0;
        if (this->_cursor == node) {
          this->_cursor = pCVar2;
        }
        if (((node->_flags & 0x30) != 0) && (pvVar1 = node[1]._passData, pvVar1 != (void *)0x0)) {
          pCVar5 = *(CBNode **)((long)pvVar1 + 0x30);
          if (pCVar5 == (CBNode *)0x0) {
LAB_00112c21:
            removeNodes();
            goto LAB_00112c26;
          }
          if (pCVar5 == node) {
            pCVar6 = (CBNode *)((long)pvVar1 + 0x30);
          }
          else {
            do {
              pCVar6 = pCVar5;
              pCVar5 = pCVar6[2]._prev;
              if (pCVar5 == (CBNode *)0x0) goto LAB_00112c21;
            } while (pCVar5 != node);
            pCVar6 = pCVar6 + 2;
          }
          pCVar6->_prev = node[2]._prev;
          *(int *)((long)pvVar1 + 0x2c) = *(int *)((long)pvVar1 + 0x2c) + -1;
        }
        bVar7 = node == extraout_RDX_00;
        node = pCVar4;
        if (bVar7) {
          return extraout_RAX;
        }
      } while( true );
    }
    if (pCVar2 == node) {
      pCVar4 = (CBNode *)((long)pvVar1 + 0x30);
    }
    else {
      do {
        pCVar4 = pCVar2;
        pCVar2 = pCVar4[2]._prev;
        if (pCVar2 == (CBNode *)0x0) goto LAB_00112b6b;
      } while (pCVar2 != node);
      pCVar4 = pCVar4 + 2;
    }
    pCVar4->_prev = node[2]._prev;
    *(int *)((long)pvVar1 + 0x2c) = *(int *)((long)pvVar1 + 0x2c) + -1;
  }
  return node;
}

Assistant:

CBNode* CodeBuilder::addAfter(CBNode* node, CBNode* ref) noexcept {
  ASMJIT_ASSERT(node);
  ASMJIT_ASSERT(ref);

  ASMJIT_ASSERT(node->_prev == nullptr);
  ASMJIT_ASSERT(node->_next == nullptr);

  CBNode* prev = ref;
  CBNode* next = ref->_next;

  node->_prev = prev;
  node->_next = next;

  prev->_next = node;
  if (next)
    next->_prev = node;
  else
    _lastNode = node;

  return node;
}